

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int CBS_get_asn1_int64_with_tag(CBS *cbs,int64_t *out,CBS_ASN1_TAG tag)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int is_negative;
  uint8_t sign_extend [8];
  CBS bytes;
  
  iVar1 = CBS_get_asn1(cbs,&bytes,tag);
  iVar3 = 0;
  if (iVar1 != 0) {
    iVar1 = CBS_is_valid_asn1_integer(&bytes,&is_negative);
    if ((iVar1 != 0) && (iVar3 = 0, bytes.len < 9)) {
      uVar2 = -(uint)(is_negative != 0) & 0xff;
      sign_extend = (uint8_t  [8])((ulong)uVar2 * 0x101010101010101);
      if (bytes.len == 0) {
        uVar2 = uVar2 << 8 | uVar2;
        uVar2 = uVar2 << 0x10 | uVar2;
        sign_extend[4] = (char)uVar2;
        sign_extend[5] = (char)(uVar2 >> 8);
        sign_extend[6] = (char)(uVar2 >> 0x10);
        sign_extend[7] = (char)(uVar2 >> 0x18);
        sign_extend[0] = (char)uVar2;
        sign_extend[1] = (char)(uVar2 >> 8);
        sign_extend[2] = (char)(uVar2 >> 0x10);
        sign_extend[3] = (char)(uVar2 >> 0x18);
      }
      else {
        memcpy((void *)((long)&bytes - bytes.len),bytes.data,bytes.len);
      }
      *out = (ulong)sign_extend >> 0x38 | ((ulong)sign_extend & 0xff000000000000) >> 0x28 |
             ((ulong)sign_extend & 0xff0000000000) >> 0x18 |
             ((ulong)sign_extend & 0xff00000000) >> 8 | ((ulong)sign_extend & 0xff000000) << 8 |
             ((ulong)sign_extend & 0xff0000) << 0x18 | ((ulong)sign_extend & 0xff00) << 0x28 |
             (long)sign_extend << 0x38;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int CBS_get_asn1_int64_with_tag(CBS *cbs, int64_t *out, CBS_ASN1_TAG tag) {
  int is_negative;
  CBS bytes;
  if (!CBS_get_asn1(cbs, &bytes, tag) ||
      !CBS_is_valid_asn1_integer(&bytes, &is_negative)) {
    return 0;
  }
  const uint8_t *data = CBS_data(&bytes);
  const size_t len = CBS_len(&bytes);
  if (len > sizeof(int64_t)) {
    return 0;
  }
  uint8_t sign_extend[sizeof(int64_t)];
  OPENSSL_memset(sign_extend, is_negative ? 0xff : 0, sizeof(sign_extend));
  OPENSSL_memcpy(sign_extend + sizeof(int64_t) - len, data, len);
  *out = CRYPTO_load_u64_be(sign_extend);
  return 1;
}